

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

void __thiscall
testing::internal::MaxBipartiteMatchState::MaxBipartiteMatchState
          (MaxBipartiteMatchState *this,MatchMatrix *graph)

{
  size_t sVar1;
  allocator<unsigned_long> local_1a;
  allocator<unsigned_long> local_19;
  MatchMatrix *local_18;
  MatchMatrix *graph_local;
  MaxBipartiteMatchState *this_local;
  
  this->graph_ = graph;
  local_18 = graph;
  graph_local = (MatchMatrix *)this;
  sVar1 = MatchMatrix::LhsSize(this->graph_);
  std::allocator<unsigned_long>::allocator(&local_19);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->left_,sVar1,&kUnused,&local_19);
  std::allocator<unsigned_long>::~allocator(&local_19);
  sVar1 = MatchMatrix::RhsSize(this->graph_);
  std::allocator<unsigned_long>::allocator(&local_1a);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&this->right_,sVar1,&kUnused,&local_1a);
  std::allocator<unsigned_long>::~allocator(&local_1a);
  return;
}

Assistant:

explicit MaxBipartiteMatchState(const MatchMatrix& graph)
      : graph_(&graph),
        left_(graph_->LhsSize(), kUnused),
        right_(graph_->RhsSize(), kUnused) {}